

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_paged_audio_buffer_init
                    (ma_paged_audio_buffer_config *pConfig,ma_paged_audio_buffer *pPagedAudioBuffer)

{
  ma_paged_audio_buffer_data *pmVar1;
  ma_result mVar2;
  ma_paged_audio_buffer_page *pmVar3;
  
  mVar2 = MA_INVALID_ARGS;
  if (pPagedAudioBuffer != (ma_paged_audio_buffer *)0x0) {
    pPagedAudioBuffer->pCurrent = (ma_paged_audio_buffer_page *)0x0;
    pPagedAudioBuffer->relativeCursor = 0;
    *(undefined8 *)&(pPagedAudioBuffer->ds).isLooping = 0;
    pPagedAudioBuffer->pData = (ma_paged_audio_buffer_data *)0x0;
    (pPagedAudioBuffer->ds).pNext = (ma_data_source *)0x0;
    (pPagedAudioBuffer->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    (pPagedAudioBuffer->ds).loopEndInFrames = 0;
    (pPagedAudioBuffer->ds).pCurrent = (ma_data_source *)0x0;
    (pPagedAudioBuffer->ds).rangeEndInFrames = 0;
    (pPagedAudioBuffer->ds).loopBegInFrames = 0;
    (pPagedAudioBuffer->ds).vtable = (ma_data_source_vtable *)0x0;
    (pPagedAudioBuffer->ds).rangeBegInFrames = 0;
    pPagedAudioBuffer->absoluteCursor = 0;
    if ((pConfig != (ma_paged_audio_buffer_config *)0x0) &&
       (pConfig->pData != (ma_paged_audio_buffer_data *)0x0)) {
      (pPagedAudioBuffer->ds).rangeBegInFrames = 0;
      (pPagedAudioBuffer->ds).rangeEndInFrames = 0;
      (pPagedAudioBuffer->ds).loopBegInFrames = 0;
      (pPagedAudioBuffer->ds).loopEndInFrames = 0;
      (pPagedAudioBuffer->ds).pCurrent = (ma_data_source *)0x0;
      (pPagedAudioBuffer->ds).pNext = (ma_data_source *)0x0;
      (pPagedAudioBuffer->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
      *(undefined8 *)&(pPagedAudioBuffer->ds).isLooping = 0;
      (pPagedAudioBuffer->ds).vtable = &g_ma_paged_audio_buffer_data_source_vtable;
      (pPagedAudioBuffer->ds).rangeEndInFrames = 0xffffffffffffffff;
      (pPagedAudioBuffer->ds).loopEndInFrames = 0xffffffffffffffff;
      (pPagedAudioBuffer->ds).pCurrent = pPagedAudioBuffer;
      (pPagedAudioBuffer->ds).pNext = (ma_data_source *)0x0;
      (pPagedAudioBuffer->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
      pmVar1 = pConfig->pData;
      pmVar3 = &pmVar1->head;
      if (pmVar1 == (ma_paged_audio_buffer_data *)0x0) {
        pmVar3 = (ma_paged_audio_buffer_page *)0x0;
      }
      pPagedAudioBuffer->pData = pmVar1;
      pPagedAudioBuffer->pCurrent = pmVar3;
      pPagedAudioBuffer->relativeCursor = 0;
      pPagedAudioBuffer->absoluteCursor = 0;
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_init(const ma_paged_audio_buffer_config* pConfig, ma_paged_audio_buffer* pPagedAudioBuffer)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pPagedAudioBuffer);

    /* A config is required for the format and channel count. */
    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->pData == NULL) {
        return MA_INVALID_ARGS; /* No underlying data specified. */
    }

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_paged_audio_buffer_data_source_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pPagedAudioBuffer->ds);
    if (result != MA_SUCCESS) {
        return result;
    }

    pPagedAudioBuffer->pData          = pConfig->pData;
    pPagedAudioBuffer->pCurrent       = ma_paged_audio_buffer_data_get_head(pConfig->pData);
    pPagedAudioBuffer->relativeCursor = 0;
    pPagedAudioBuffer->absoluteCursor = 0;

    return MA_SUCCESS;
}